

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O3

bool __thiscall
cmProjectCommand::InitialPass
          (cmProjectCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  PolicyStatus PVar7;
  int iVar8;
  string *psVar9;
  char *pcVar10;
  undefined8 uVar11;
  code *pcVar12;
  uint7 extraout_var_00;
  uint7 extraout_var_01;
  ostream *poVar13;
  long *plVar14;
  size_t sVar15;
  code *pcVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  PolicyID id;
  long lVar18;
  pointer pbVar19;
  undefined8 uVar20;
  _Any_data *name;
  ulong uVar21;
  ulong uVar22;
  string *i;
  string *psVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string vv;
  string vs;
  anon_class_8_1_0e9793f7 resetReporter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string extraInclude;
  string srcdir;
  string homepage;
  string description;
  string version;
  string bindir;
  uint v [4];
  RegularExpression vx;
  string local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f8;
  string *local_3f0;
  _Any_data local_3e8;
  code *local_3d8;
  code *pcStack_3d0;
  undefined1 local_3c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  code *local_388;
  _Any_data *local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  undefined8 local_368;
  _Any_data local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348 [3];
  char local_318 [48];
  ios_base local_2e8 [16];
  char local_2d8 [64];
  char local_298 [192];
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  string local_1b8;
  char *local_198;
  undefined8 local_190;
  char local_188;
  undefined7 uStack_187;
  char *local_178;
  undefined8 local_170;
  char local_168;
  undefined7 uStack_167;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  uint local_118 [2];
  undefined8 uStack_110;
  undefined1 local_100 [80];
  char *local_b0;
  char *local_60;
  char *local_40;
  uint7 extraout_var;
  
  psVar23 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (psVar23 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_358._M_unused._M_object = local_348;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_358,"PROJECT called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_unused._0_8_ != local_348) {
      operator_delete(local_358._M_unused._M_object,(ulong)(local_348[0]._M_allocated_capacity + 1))
      ;
    }
    return false;
  }
  cmMakefile::SetProjectName((this->super_cmCommand).Makefile,psVar23);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  pcVar1 = (psVar23->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar1,pcVar1 + psVar23->_M_string_length);
  std::__cxx11::string::append((char *)&local_138);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  pcVar1 = (psVar23->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar1,pcVar1 + psVar23->_M_string_length);
  std::__cxx11::string::append((char *)&local_1b8);
  pcVar2 = (this->super_cmCommand).Makefile;
  psVar9 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
  cmMakefile::AddCacheDefinition
            (pcVar2,&local_138,(psVar9->_M_dataplus)._M_p,"Value Computed by CMake",STATIC,false);
  pcVar2 = (this->super_cmCommand).Makefile;
  psVar9 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar2);
  cmMakefile::AddCacheDefinition
            (pcVar2,&local_1b8,(psVar9->_M_dataplus)._M_p,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::_M_replace((ulong)&local_138,0,(char *)local_138._M_string_length,0x4c32b4);
  std::__cxx11::string::_M_replace((ulong)&local_1b8,0,(char *)local_1b8._M_string_length,0x4c32c7);
  pcVar2 = (this->super_cmCommand).Makefile;
  psVar9 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
  cmMakefile::AddDefinition(pcVar2,&local_138,(psVar9->_M_dataplus)._M_p);
  pcVar2 = (this->super_cmCommand).Makefile;
  psVar9 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar2);
  cmMakefile::AddDefinition(pcVar2,&local_1b8,(psVar9->_M_dataplus)._M_p);
  pcVar2 = (this->super_cmCommand).Makefile;
  local_358._M_unused._M_object = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"PROJECT_NAME","");
  cmMakefile::AddDefinition(pcVar2,(string *)&local_358,(psVar23->_M_dataplus)._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_unused._0_8_ != local_348) {
    operator_delete(local_358._M_unused._M_object,(ulong)(local_348[0]._M_allocated_capacity + 1));
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  local_358._M_unused._M_object = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"CMAKE_PROJECT_NAME","");
  name = &local_358;
  pcVar10 = cmMakefile::GetDefinition(pcVar2,(string *)name);
  if (pcVar10 == (char *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_unused._0_8_ != local_348) {
      operator_delete(local_358._M_unused._M_object,(ulong)(local_348[0]._M_allocated_capacity + 1))
      ;
    }
LAB_002438bb:
    pcVar2 = (this->super_cmCommand).Makefile;
    local_358._M_unused._M_object = local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"CMAKE_PROJECT_NAME","");
    cmMakefile::AddDefinition(pcVar2,(string *)&local_358,(psVar23->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_unused._0_8_ != local_348) {
      operator_delete(local_358._M_unused._M_object,(ulong)(local_348[0]._M_allocated_capacity + 1))
      ;
    }
    pcVar2 = (this->super_cmCommand).Makefile;
    local_358._M_unused._M_object = local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"CMAKE_PROJECT_NAME","");
    cmMakefile::AddCacheDefinition
              (pcVar2,(string *)&local_358,(psVar23->_M_dataplus)._M_p,"Value Computed by CMake",
               STATIC,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_unused._0_8_ != local_348) {
      operator_delete(local_358._M_unused._M_object,(ulong)(local_348[0]._M_allocated_capacity + 1))
      ;
    }
  }
  else {
    bVar3 = cmMakefile::IsRootMakefile((this->super_cmCommand).Makefile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_unused._0_8_ != local_348) {
      operator_delete(local_358._M_unused._M_object,(ulong)(local_348[0]._M_allocated_capacity + 1))
      ;
    }
    if (bVar3) goto LAB_002438bb;
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  uVar22 = 0;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_178 = &local_168;
  local_170 = 0;
  local_168 = '\0';
  local_198 = &local_188;
  local_190 = 0;
  local_188 = '\0';
  local_368 = 0;
  local_378._M_allocated_capacity = 0;
  local_378._8_8_ = 0;
  local_380 = &local_3e8;
  local_3d8 = (code *)0x0;
  pcStack_3d0 = (code *)0x0;
  local_3e8._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_3e8._8_8_ = (_Any_data **)0x0;
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pcVar16 = (code *)0x0;
  local_1d0 = 0;
  local_3f0 = psVar23;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19) < 0x21) {
LAB_00244021:
    PVar7 = cmMakefile::GetPolicyStatus(*(cmMakefile **)((long)this + 8),CMP0048,false);
    if ((uVar22 & 1) == 0) {
      if (PVar7 != OLD) {
        local_3c8._0_8_ = (string *)0x0;
        local_3c8._8_8_ = (string *)0x0;
        local_3c8._16_8_ = (pointer)0x0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[16]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
                   (char (*) [16])0x4c3498);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
                   (char (*) [22])0x4c34ae);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
                   (char (*) [22])0x4c34ca);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
                   (char (*) [22])0x4c34e6);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
                   (char (*) [22])0x4c3502);
        psVar23 = local_3f0;
        local_358._M_unused._M_object = local_348;
        pcVar1 = (local_3f0->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_358,pcVar1,pcVar1 + local_3f0->_M_string_length);
        std::__cxx11::string::append(local_358._M_pod_data);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_358);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_unused._0_8_ != local_348) {
          operator_delete(local_358._M_unused._M_object,
                          (ulong)(local_348[0]._M_allocated_capacity + 1));
        }
        local_358._M_unused._M_object = local_348;
        pcVar1 = (psVar23->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_358,pcVar1,pcVar1 + psVar23->_M_string_length);
        std::__cxx11::string::append(local_358._M_pod_data);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_358);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_unused._0_8_ != local_348) {
          operator_delete(local_358._M_unused._M_object,
                          (ulong)(local_348[0]._M_allocated_capacity + 1));
        }
        local_358._M_unused._M_object = local_348;
        pcVar1 = (psVar23->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_358,pcVar1,pcVar1 + psVar23->_M_string_length);
        std::__cxx11::string::append(local_358._M_pod_data);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_358);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_unused._0_8_ != local_348) {
          operator_delete(local_358._M_unused._M_object,
                          (ulong)(local_348[0]._M_allocated_capacity + 1));
        }
        local_358._M_unused._M_object = local_348;
        pcVar1 = (psVar23->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_358,pcVar1,pcVar1 + psVar23->_M_string_length);
        std::__cxx11::string::append(local_358._M_pod_data);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_358);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_unused._0_8_ != local_348) {
          operator_delete(local_358._M_unused._M_object,
                          (ulong)(local_348[0]._M_allocated_capacity + 1));
        }
        local_358._M_unused._M_object = local_348;
        pcVar1 = (psVar23->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_358,pcVar1,pcVar1 + psVar23->_M_string_length);
        std::__cxx11::string::append(local_358._M_pod_data);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_358);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_unused._0_8_ != local_348) {
          operator_delete(local_358._M_unused._M_object,
                          (ulong)(local_348[0]._M_allocated_capacity + 1));
        }
        bVar3 = cmMakefile::IsRootMakefile(*(cmMakefile **)((long)this + 8));
        if (bVar3) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[22]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
                     (char (*) [22])"CMAKE_PROJECT_VERSION");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_MAJOR");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_MINOR");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_PATCH");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3c8,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_TWEAK");
        }
        uVar11 = local_3c8._8_8_;
        local_100._0_8_ = local_100 + 0x10;
        local_100._8_8_ = (char *)0x0;
        local_100[0x10] = '\0';
        if (local_3c8._0_8_ != local_3c8._8_8_) {
          psVar23 = (string *)local_3c8._0_8_;
          do {
            pcVar10 = cmMakefile::GetDefinition(*(cmMakefile **)((long)this + 8),psVar23);
            if ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0')) {
              if (PVar7 == WARN) {
                if ((local_1d0 & 1) == 0) {
                  std::__cxx11::string::append(local_100);
                  std::__cxx11::string::_M_append(local_100,(ulong)(psVar23->_M_dataplus)._M_p);
                }
              }
              else {
                cmMakefile::AddDefinition(*(cmMakefile **)((long)this + 8),psVar23,"");
              }
            }
            psVar23 = psVar23 + 1;
          } while (psVar23 != (string *)uVar11);
          if ((char *)local_100._8_8_ != (char *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358._M_pod_data);
            cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&local_3a8,(cmPolicies *)0x30,id);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_358,(char *)local_3a8._M_allocated_capacity,
                                 local_3a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,"\nThe following variable(s) would be set to empty:",0x31);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,(char *)local_100._0_8_,local_100._8_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_allocated_capacity != &local_398) {
              operator_delete((void *)local_3a8._M_allocated_capacity,
                              CONCAT71(local_398._M_allocated_capacity._1_7_,
                                       local_398._M_local_buf[0]) + 1);
            }
            pcVar2 = *(cmMakefile **)((long)this + 8);
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)&local_3a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_allocated_capacity != &local_398) {
              operator_delete((void *)local_3a8._M_allocated_capacity,
                              CONCAT71(local_398._M_allocated_capacity._1_7_,
                                       local_398._M_local_buf[0]) + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358._M_pod_data);
            std::ios_base::~ios_base(local_2e8);
          }
        }
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3c8);
      }
    }
    else {
      if (PVar7 < NEW) {
        pcVar2 = *(cmMakefile **)((long)this + 8);
        local_358._M_unused._M_object = local_348;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_358,"VERSION not allowed unless CMP0048 is set to NEW","");
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_358);
        goto LAB_002450b1;
      }
      local_100._0_8_ = (char *)0x0;
      local_b0 = (char *)0x0;
      local_60 = (char *)0x0;
      local_40 = (char *)0x0;
      cmsys::RegularExpression::compile
                ((RegularExpression *)local_100,"^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
      cVar4 = cmsys::RegularExpression::find
                        ((RegularExpression *)local_100,local_158._M_dataplus._M_p,
                         (RegularExpressionMatch *)local_100);
      if ((bool)cVar4) {
        local_388 = (code *)CONCAT71(local_388._1_7_,cVar4);
        local_3a8._M_allocated_capacity = (size_type)&local_398;
        local_3a8._8_8_ = 0;
        local_398._M_local_buf[0] = '\0';
        local_118[0] = 0;
        local_118[1] = 0;
        uStack_110 = 0;
        local_3f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)this;
        iVar8 = __isoc99_sscanf(local_158._M_dataplus._M_p,"%u.%u.%u.%u",local_118,local_118 + 1,
                                &uStack_110,(long)&uStack_110 + 4);
        lVar18 = 0;
        do {
          if (lVar18 < iVar8) {
            sprintf(name->_M_pod_data,"%u",(ulong)local_118[lVar18]);
            std::__cxx11::string::append(local_3a8._M_local_buf);
            std::__cxx11::string::append(local_3a8._M_local_buf);
          }
          else {
            name->_M_pod_data[0] = '\0';
          }
          lVar18 = lVar18 + 1;
          name = name + 4;
        } while (lVar18 != 4);
        local_3c8._0_8_ = local_3c8 + 0x10;
        local_3c8._8_8_ = (string *)0x0;
        local_3c8._16_8_ = local_3c8._16_8_ & 0xffffffffffffff00;
        paVar17 = &local_418.field_2;
        pcVar1 = (local_3f0->_M_dataplus)._M_p;
        local_418._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_418,pcVar1,pcVar1 + local_3f0->_M_string_length);
        std::__cxx11::string::append((char *)&local_418);
        this = (cmProjectCommand *)local_3f8;
        std::__cxx11::string::operator=((string *)local_3c8,(string *)&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar17) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = *(cmMakefile **)((long)this + 8);
        local_418._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"PROJECT_VERSION","");
        cmMakefile::AddDefinition(pcVar2,&local_418,(char *)local_3a8._M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar17) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        cmMakefile::AddDefinition
                  (*(cmMakefile **)((long)this + 8),(string *)local_3c8,
                   (char *)local_3a8._M_allocated_capacity);
        pcVar1 = (local_3f0->_M_dataplus)._M_p;
        local_418._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_418,pcVar1,pcVar1 + local_3f0->_M_string_length);
        std::__cxx11::string::append((char *)&local_418);
        std::__cxx11::string::operator=((string *)local_3c8,(string *)&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar17) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = *(cmMakefile **)((long)this + 8);
        local_418._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_418,"PROJECT_VERSION_MAJOR","");
        cmMakefile::AddDefinition(pcVar2,&local_418,local_358._M_pod_data);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar17) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        cmMakefile::AddDefinition
                  (*(cmMakefile **)((long)this + 8),(string *)local_3c8,local_358._M_pod_data);
        pcVar1 = (local_3f0->_M_dataplus)._M_p;
        local_418._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_418,pcVar1,pcVar1 + local_3f0->_M_string_length);
        std::__cxx11::string::append((char *)&local_418);
        std::__cxx11::string::operator=((string *)local_3c8,(string *)&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar17) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = *(cmMakefile **)((long)this + 8);
        local_418._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_418,"PROJECT_VERSION_MINOR","");
        cmMakefile::AddDefinition(pcVar2,&local_418,local_318);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar17) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        cmMakefile::AddDefinition(*(cmMakefile **)((long)this + 8),(string *)local_3c8,local_318);
        pcVar1 = (local_3f0->_M_dataplus)._M_p;
        local_418._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_418,pcVar1,pcVar1 + local_3f0->_M_string_length);
        std::__cxx11::string::append((char *)&local_418);
        std::__cxx11::string::operator=((string *)local_3c8,(string *)&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar17) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = *(cmMakefile **)((long)this + 8);
        local_418._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_418,"PROJECT_VERSION_PATCH","");
        cmMakefile::AddDefinition(pcVar2,&local_418,local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar17) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        cmMakefile::AddDefinition(*(cmMakefile **)((long)this + 8),(string *)local_3c8,local_2d8);
        pcVar1 = (local_3f0->_M_dataplus)._M_p;
        local_418._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_418,pcVar1,pcVar1 + local_3f0->_M_string_length);
        std::__cxx11::string::append((char *)&local_418);
        std::__cxx11::string::operator=((string *)local_3c8,(string *)&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar17) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = *(cmMakefile **)((long)this + 8);
        local_418._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_418,"PROJECT_VERSION_TWEAK","");
        cmMakefile::AddDefinition(pcVar2,&local_418,local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar17) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        cmMakefile::AddDefinition(*(cmMakefile **)((long)this + 8),(string *)local_3c8,local_298);
        TopLevelCMakeVarCondSet
                  (this,"CMAKE_PROJECT_VERSION",(char *)local_3a8._M_allocated_capacity);
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_MAJOR",local_358._M_pod_data);
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_MINOR",local_318);
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_PATCH",local_2d8);
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_TWEAK",local_298);
        if ((string *)local_3c8._0_8_ != (string *)(local_3c8 + 0x10)) {
          operator_delete((void *)local_3c8._0_8_,(ulong)(local_3c8._16_8_ + 1));
        }
        cVar4 = (char)local_388;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_allocated_capacity != &local_398) {
          uVar11 = (code *)CONCAT71(local_398._M_allocated_capacity._1_7_,local_398._M_local_buf[0])
          ;
          uVar20 = local_3a8._M_allocated_capacity;
LAB_00244c1f:
          operator_delete((void *)uVar20,(ulong)(uVar11 + 1));
        }
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_3a8,"VERSION \"",&local_158);
        plVar14 = (long *)std::__cxx11::string::append(local_3a8._M_local_buf);
        local_358._M_unused._M_object = local_348;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar17) {
          local_348[0]._0_8_ = paVar17->_M_allocated_capacity;
          local_348[0]._8_8_ = plVar14[3];
        }
        else {
          local_348[0]._0_8_ = paVar17->_M_allocated_capacity;
          local_358._M_unused._M_object =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar14;
        }
        local_358._8_8_ = plVar14[1];
        *plVar14 = (long)paVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_allocated_capacity != &local_398) {
          operator_delete((void *)local_3a8._M_allocated_capacity,
                          CONCAT71(local_398._M_allocated_capacity._1_7_,local_398._M_local_buf[0])
                          + 1);
        }
        cmMakefile::IssueMessage(*(cmMakefile **)((long)this + 8),FATAL_ERROR,(string *)&local_358);
        cmSystemTools::s_FatalErrorOccured = true;
        uVar11 = local_348[0]._M_allocated_capacity;
        uVar20 = local_358._M_unused._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_unused._0_8_ != local_348) goto LAB_00244c1f;
      }
      if (local_40 != (char *)0x0) {
        operator_delete__(local_40);
      }
      bVar3 = true;
      if (cVar4 == '\0') goto LAB_002450e3;
    }
    pcVar2 = *(cmMakefile **)((long)this + 8);
    local_358._M_unused._M_object = local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"PROJECT_DESCRIPTION","");
    cmMakefile::AddDefinition(pcVar2,(string *)&local_358,local_178);
    psVar23 = local_3f0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_unused._0_8_ != local_348) {
      operator_delete(local_358._M_unused._M_object,(ulong)(local_348[0]._M_allocated_capacity + 1))
      ;
    }
    pcVar2 = *(cmMakefile **)((long)this + 8);
    local_358._M_unused._M_object = local_348;
    pcVar1 = (psVar23->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_358,pcVar1,pcVar1 + psVar23->_M_string_length);
    std::__cxx11::string::append(local_358._M_pod_data);
    cmMakefile::AddDefinition(pcVar2,(string *)&local_358,local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_unused._0_8_ != local_348) {
      operator_delete(local_358._M_unused._M_object,(ulong)(local_348[0]._M_allocated_capacity + 1))
      ;
    }
    TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_DESCRIPTION",local_178);
    pcVar2 = *(cmMakefile **)((long)this + 8);
    local_358._M_unused._M_object = local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"PROJECT_HOMEPAGE_URL","");
    cmMakefile::AddDefinition(pcVar2,(string *)&local_358,local_198);
    psVar23 = local_3f0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_unused._0_8_ != local_348) {
      operator_delete(local_358._M_unused._M_object,(ulong)(local_348[0]._M_allocated_capacity + 1))
      ;
    }
    pcVar2 = *(cmMakefile **)((long)this + 8);
    local_358._M_unused._M_object = local_348;
    pcVar1 = (psVar23->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_358,pcVar1,pcVar1 + psVar23->_M_string_length);
    std::__cxx11::string::append(local_358._M_pod_data);
    cmMakefile::AddDefinition(pcVar2,(string *)&local_358,local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_unused._0_8_ != local_348) {
      operator_delete(local_358._M_unused._M_object,(ulong)(local_348[0]._M_allocated_capacity + 1))
      ;
    }
    TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_HOMEPAGE_URL",local_198);
    if (local_378._M_allocated_capacity == local_378._8_8_) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[2]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_378._M_local_buf,(char (*) [2])0x4b867b);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_378._M_local_buf,(char (*) [4])0x4d313e);
    }
    cmMakefile::EnableLanguage
              (*(cmMakefile **)((long)this + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_378,false);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   "CMAKE_PROJECT_",local_3f0);
    plVar14 = (long *)std::__cxx11::string::append(local_100);
    local_358._M_unused._M_object = local_348;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar17) {
      local_348[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_348[0]._8_8_ = plVar14[3];
    }
    else {
      local_348[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_358._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar14;
    }
    local_358._8_8_ = plVar14[1];
    *plVar14 = (long)paVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
    }
    pcVar10 = cmMakefile::GetDefinition(*(cmMakefile **)((long)this + 8),(string *)&local_358);
    bVar3 = true;
    if (pcVar10 != (char *)0x0) {
      pcVar2 = *(cmMakefile **)((long)this + 8);
      local_100._0_8_ = local_100 + 0x10;
      sVar15 = strlen(pcVar10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,pcVar10,pcVar10 + sVar15);
      bVar5 = cmMakefile::ReadDependentFile(pcVar2,(string *)local_100,true);
      if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
        operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
      }
      if (((!bVar5) && (cmSystemTools::s_FatalErrorOccured == false)) &&
         (bVar5 = cmSystemTools::GetInterruptFlag(), !bVar5)) {
        local_100._0_8_ = local_100 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_100,"could not find file:\n  ","");
        std::__cxx11::string::append(local_100);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_100);
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
        }
        bVar3 = false;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_unused._0_8_ != local_348) {
      operator_delete(local_358._M_unused._M_object,(ulong)(local_348[0]._M_allocated_capacity + 1))
      ;
    }
  }
  else {
    iVar8 = 2;
    uVar21 = 1;
    lVar18 = 0x20;
    local_1c0 = 0;
    local_388 = (code *)0x0;
    local_1c8 = 0;
    local_1d8 = 0;
    local_1d0 = 0;
    local_3f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)this;
    do {
      iVar6 = std::__cxx11::string::compare((char *)((long)&(pbVar19->_M_dataplus)._M_p + lVar18));
      if (iVar6 == 0) {
        if (((ulong)local_388 & 1) != 0) {
          pcVar2 = *(cmMakefile **)(local_3f8->_M_local_buf + 8);
          local_358._M_unused._M_object = local_348;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_358,"LANGUAGES may be specified at most once.","");
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_358);
          goto LAB_002450b1;
        }
        if (local_3d8 != (code *)0x0) {
          (*pcStack_3d0)(&local_3e8);
        }
        pcVar16 = (code *)CONCAT71((int7)((ulong)pcVar16 >> 8),1);
        iVar8 = 2;
        local_388 = pcVar16;
        if (local_378._M_allocated_capacity != local_378._8_8_) {
          local_358._M_unused._M_object = local_348;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_358,
                     "the following parameters must be specified after LANGUAGES keyword: ","");
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_100,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_378,", ");
          std::__cxx11::string::_M_append(local_358._M_pod_data,local_100._0_8_);
          if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
            operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
          }
          std::__cxx11::string::push_back((char)&local_358);
          cmMakefile::IssueMessage
                    (*(cmMakefile **)(local_3f8->_M_local_buf + 8),WARNING,(string *)&local_358);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_unused._0_8_ != local_348) {
            operator_delete(local_358._M_unused._M_object,
                            (ulong)(local_348[0]._M_allocated_capacity + 1));
          }
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare
                          ((char *)((long)&(((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_dataplus)._M_p + lVar18));
        if (iVar6 == 0) {
          if ((local_1c0 & 1) != 0) {
            pcVar2 = *(cmMakefile **)(local_3f8->_M_local_buf + 8);
            local_358._M_unused._M_object = local_348;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_358,"VERSION may be specified at most once.","");
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_358);
            goto LAB_002450b1;
          }
          if (local_3d8 == (code *)0x0) {
            pcVar12 = (code *)0x0;
          }
          else {
            (*pcStack_3d0)(&local_3e8);
            pcVar12 = local_3d8;
          }
          local_358._M_unused._M_object = local_3e8._M_unused._M_object;
          local_358._8_8_ = local_3e8._8_8_;
          local_3e8._M_unused._M_function_pointer = (_func_void *)local_3f8;
          local_3e8._8_8_ = &local_380;
          local_3d8 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmProjectCommand.cxx:123:29)>
                      ::_M_manager;
          local_348[0]._8_8_ = pcStack_3d0;
          pcVar16 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmProjectCommand.cxx:123:29)>
                    ::_M_invoke;
          pcStack_3d0 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmProjectCommand.cxx:123:29)>
                        ::_M_invoke;
          local_348[0]._0_8_ = pcVar12;
          if (pcVar12 != (code *)0x0) {
            (*pcVar12)(&local_358,&local_358,__destroy_functor);
            pcVar12 = (code *)((ulong)extraout_var_00 << 8);
          }
          local_1c0 = CONCAT71((int7)((ulong)pcVar12 >> 8),1);
          iVar8 = 3;
        }
        else {
          iVar6 = std::__cxx11::string::compare
                            ((char *)((long)&(((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar18));
          if (iVar6 == 0) {
            if ((local_1c8 & 1) != 0) {
              pcVar2 = *(cmMakefile **)(local_3f8->_M_local_buf + 8);
              local_358._M_unused._M_object = local_348;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_358,"DESCRIPTION may be specified at most once.","");
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_358);
              goto LAB_002450b1;
            }
            if (local_3d8 == (code *)0x0) {
              pcVar12 = (code *)0x0;
            }
            else {
              (*pcStack_3d0)(&local_3e8);
              pcVar12 = local_3d8;
            }
            local_358._M_unused._M_object = local_3e8._M_unused._M_object;
            local_358._8_8_ = local_3e8._8_8_;
            local_3e8._M_unused._M_function_pointer = (_func_void *)local_3f8;
            local_3e8._8_8_ = &local_380;
            local_3d8 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmProjectCommand.cxx:143:29)>
                        ::_M_manager;
            local_348[0]._8_8_ = pcStack_3d0;
            pcVar16 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmProjectCommand.cxx:143:29)>
                      ::_M_invoke;
            pcStack_3d0 = std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmProjectCommand.cxx:143:29)>
                          ::_M_invoke;
            local_348[0]._0_8_ = pcVar12;
            if (pcVar12 != (code *)0x0) {
              (*pcVar12)(&local_358,&local_358,__destroy_functor);
              pcVar12 = (code *)((ulong)extraout_var_01 << 8);
            }
            local_1c8 = CONCAT71((int7)((ulong)pcVar12 >> 8),1);
            iVar8 = 0;
          }
          else {
            iVar6 = std::__cxx11::string::compare
                              ((char *)((long)&(((args->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar18));
            pcVar12 = local_3d8;
            if (iVar6 == 0) {
              if ((local_1d8 & 1) != 0) {
                pcVar2 = *(cmMakefile **)(local_3f8->_M_local_buf + 8);
                local_358._M_unused._M_object = local_348;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_358,"HOMEPAGE_URL may be specified at most once.","");
                cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_358);
                goto LAB_002450b1;
              }
              local_358._M_unused._M_object = local_3e8._M_unused._M_object;
              local_358._8_8_ = local_3e8._8_8_;
              local_3e8._M_unused._M_function_pointer = (_func_void *)local_3f8;
              local_3e8._8_8_ = &local_380;
              local_348[0]._M_allocated_capacity = local_3d8;
              local_3d8 = std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmProjectCommand.cxx:160:29)>
                          ::_M_manager;
              local_348[0]._8_8_ = pcStack_3d0;
              pcVar16 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmProjectCommand.cxx:160:29)>
                        ::_M_invoke;
              pcStack_3d0 = std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmProjectCommand.cxx:160:29)>
                            ::_M_invoke;
              if (pcVar12 != (code *)0x0) {
                (*pcVar12)(&local_358,&local_358,__destroy_functor);
                pcVar12 = (code *)((ulong)extraout_var << 8);
              }
              local_1d8 = CONCAT71((int7)((ulong)pcVar12 >> 8),1);
              iVar8 = 1;
            }
            else if ((uVar21 == 1) &&
                    (uVar11 = std::__cxx11::string::compare
                                        ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1)),
                    (int)uVar11 == 0)) {
              local_1d0 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
            }
            else {
              if (iVar8 == 0) {
                std::__cxx11::string::_M_assign((string *)&local_178);
                local_348[0]._M_allocated_capacity = (code *)0x0;
                local_348[0]._8_8_ = (code *)0x0;
                local_358._M_unused._M_object =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_358._8_8_ = (_Any_data **)0x0;
                std::function<void_()>::operator=
                          ((function<void_()> *)local_380,(function<void_()> *)&local_358);
                if ((code *)local_348[0]._0_8_ != (code *)0x0) {
                  (*(code *)local_348[0]._0_8_)(&local_358,&local_358,3);
                }
              }
              else if (iVar8 == 1) {
                std::__cxx11::string::_M_assign((string *)&local_198);
                local_348[0]._M_allocated_capacity = (code *)0x0;
                local_348[0]._8_8_ = (code *)0x0;
                local_358._M_unused._M_object =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_358._8_8_ = (_Any_data **)0x0;
                std::function<void_()>::operator=
                          ((function<void_()> *)local_380,(function<void_()> *)&local_358);
                if ((code *)local_348[0]._0_8_ != (code *)0x0) {
                  (*(code *)local_348[0]._0_8_)(&local_358,&local_358,3);
                }
              }
              else {
                if (iVar8 != 3) {
                  iVar8 = 2;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_378,
                              (value_type *)
                              ((long)&(((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar18));
                  goto LAB_00243f3d;
                }
                std::__cxx11::string::_M_assign((string *)&local_158);
                local_348[0]._M_allocated_capacity = (code *)0x0;
                local_348[0]._8_8_ = (code *)0x0;
                local_358._M_unused._M_object =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_358._8_8_ = (_Any_data **)0x0;
                std::function<void_()>::operator=
                          ((function<void_()> *)local_380,(function<void_()> *)&local_358);
                if ((code *)local_348[0]._0_8_ != (code *)0x0) {
                  (*(code *)local_348[0]._0_8_)(&local_358,&local_358,3);
                }
              }
              iVar8 = 2;
            }
          }
        }
      }
LAB_00243f3d:
      uVar22 = local_1c0;
      this = (cmProjectCommand *)local_3f8;
      uVar21 = uVar21 + 1;
      pbVar19 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar18 = lVar18 + 0x20;
    } while (uVar21 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19 >> 5
                             ));
    if (local_3d8 != (code *)0x0) {
      (*pcStack_3d0)(&local_3e8);
    }
    if ((((byte)local_1c8 | (byte)uVar22 | (byte)local_1d8) & 1) == 0) {
      uVar22 = 0;
      if (((ulong)local_388 & 1) != 0) goto LAB_00243ffb;
      goto LAB_00244021;
    }
    if (((ulong)local_388 & 1) != 0) {
LAB_00243ffb:
      if (local_378._M_allocated_capacity == local_378._8_8_) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[5]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   local_378._M_local_buf,(char (*) [5])0x5030ad);
      }
      goto LAB_00244021;
    }
    if (local_378._M_allocated_capacity == local_378._8_8_) goto LAB_00244021;
    pcVar2 = *(cmMakefile **)((long)this + 8);
    local_358._M_unused._M_object = local_348;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_358,
               "project with VERSION, DESCRIPTION or HOMEPAGE_URL must use LANGUAGES before language names."
               ,"");
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_358);
LAB_002450b1:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_unused._0_8_ != local_348) {
      operator_delete(local_358._M_unused._M_object,(ulong)(local_348[0]._M_allocated_capacity + 1))
      ;
    }
    cmSystemTools::s_FatalErrorOccured = true;
    bVar3 = true;
  }
LAB_002450e3:
  if (local_3d8 != (code *)0x0) {
    (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_378);
  if (local_198 != &local_188) {
    operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmProjectCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("PROJECT called with incorrect number of arguments");
    return false;
  }

  std::string const& projectName = args[0];

  this->Makefile->SetProjectName(projectName);

  std::string bindir = projectName;
  bindir += "_BINARY_DIR";
  std::string srcdir = projectName;
  srcdir += "_SOURCE_DIR";

  this->Makefile->AddCacheDefinition(
    bindir, this->Makefile->GetCurrentBinaryDirectory().c_str(),
    "Value Computed by CMake", cmStateEnums::STATIC);
  this->Makefile->AddCacheDefinition(
    srcdir, this->Makefile->GetCurrentSourceDirectory().c_str(),
    "Value Computed by CMake", cmStateEnums::STATIC);

  bindir = "PROJECT_BINARY_DIR";
  srcdir = "PROJECT_SOURCE_DIR";

  this->Makefile->AddDefinition(
    bindir, this->Makefile->GetCurrentBinaryDirectory().c_str());
  this->Makefile->AddDefinition(
    srcdir, this->Makefile->GetCurrentSourceDirectory().c_str());

  this->Makefile->AddDefinition("PROJECT_NAME", projectName.c_str());

  // Set the CMAKE_PROJECT_NAME variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one, so that
  // CMAKE_PROJECT_NAME will match PROJECT_NAME, and cmake --build
  // will work.
  if (!this->Makefile->GetDefinition("CMAKE_PROJECT_NAME") ||
      (this->Makefile->IsRootMakefile())) {
    this->Makefile->AddDefinition("CMAKE_PROJECT_NAME", projectName.c_str());
    this->Makefile->AddCacheDefinition(
      "CMAKE_PROJECT_NAME", projectName.c_str(), "Value Computed by CMake",
      cmStateEnums::STATIC);
  }

  bool haveVersion = false;
  bool haveLanguages = false;
  bool haveDescription = false;
  bool haveHomepage = false;
  bool injectedProjectCommand = false;
  std::string version;
  std::string description;
  std::string homepage;
  std::vector<std::string> languages;
  std::function<void()> missedValueReporter;
  auto resetReporter = [&missedValueReporter]() {
    missedValueReporter = std::function<void()>();
  };
  enum Doing
  {
    DoingDescription,
    DoingHomepage,
    DoingLanguages,
    DoingVersion
  };
  Doing doing = DoingLanguages;
  for (size_t i = 1; i < args.size(); ++i) {
    if (args[i] == "LANGUAGES") {
      if (haveLanguages) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "LANGUAGES may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveLanguages = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingLanguages;
      if (!languages.empty()) {
        std::string msg =
          "the following parameters must be specified after LANGUAGES "
          "keyword: ";
        msg += cmJoin(languages, ", ");
        msg += '.';
        this->Makefile->IssueMessage(MessageType::WARNING, msg);
      }
    } else if (args[i] == "VERSION") {
      if (haveVersion) {
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                     "VERSION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveVersion = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingVersion;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "VERSION keyword not followed by a value or was followed by a "
          "value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "DESCRIPTION") {
      if (haveDescription) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "DESCRIPTION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveDescription = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingDescription;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "DESCRIPTION keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "HOMEPAGE_URL") {
      if (haveHomepage) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "HOMEPAGE_URL may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveHomepage = true;
      doing = DoingHomepage;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "HOMEPAGE_URL keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (i == 1 && args[i] == "__CMAKE_INJECTED_PROJECT_COMMAND__") {
      injectedProjectCommand = true;
    } else if (doing == DoingVersion) {
      doing = DoingLanguages;
      version = args[i];
      resetReporter();
    } else if (doing == DoingDescription) {
      doing = DoingLanguages;
      description = args[i];
      resetReporter();
    } else if (doing == DoingHomepage) {
      doing = DoingLanguages;
      homepage = args[i];
      resetReporter();
    } else // doing == DoingLanguages
    {
      languages.push_back(args[i]);
    }
  }

  if (missedValueReporter) {
    missedValueReporter();
  }

  if ((haveVersion || haveDescription || haveHomepage) && !haveLanguages &&
      !languages.empty()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "project with VERSION, DESCRIPTION or HOMEPAGE_URL must "
      "use LANGUAGES before language names.");
    cmSystemTools::SetFatalErrorOccured();
    return true;
  }
  if (haveLanguages && languages.empty()) {
    languages.emplace_back("NONE");
  }

  cmPolicies::PolicyStatus cmp0048 =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0048);
  if (haveVersion) {
    // Set project VERSION variables to given values
    if (cmp0048 == cmPolicies::OLD || cmp0048 == cmPolicies::WARN) {
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        "VERSION not allowed unless CMP0048 is set to NEW");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }

    cmsys::RegularExpression vx(
      "^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
    if (!vx.find(version)) {
      std::string e = "VERSION \"" + version + "\" format invalid.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }

    std::string vs;
    const char* sep = "";
    char vb[4][64];
    unsigned int v[4] = { 0, 0, 0, 0 };
    int vc =
      sscanf(version.c_str(), "%u.%u.%u.%u", &v[0], &v[1], &v[2], &v[3]);
    for (int i = 0; i < 4; ++i) {
      if (i < vc) {
        sprintf(vb[i], "%u", v[i]);
        vs += sep;
        vs += vb[i];
        sep = ".";
      } else {
        vb[i][0] = 0;
      }
    }

    std::string vv;
    vv = projectName + "_VERSION";
    this->Makefile->AddDefinition("PROJECT_VERSION", vs.c_str());
    this->Makefile->AddDefinition(vv, vs.c_str());
    vv = projectName + "_VERSION_MAJOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MAJOR", vb[0]);
    this->Makefile->AddDefinition(vv, vb[0]);
    vv = projectName + "_VERSION_MINOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MINOR", vb[1]);
    this->Makefile->AddDefinition(vv, vb[1]);
    vv = projectName + "_VERSION_PATCH";
    this->Makefile->AddDefinition("PROJECT_VERSION_PATCH", vb[2]);
    this->Makefile->AddDefinition(vv, vb[2]);
    vv = projectName + "_VERSION_TWEAK";
    this->Makefile->AddDefinition("PROJECT_VERSION_TWEAK", vb[3]);
    this->Makefile->AddDefinition(vv, vb[3]);
    // Also, try set top level variables
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION", vs.c_str());
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_MAJOR", vb[0]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_MINOR", vb[1]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_PATCH", vb[2]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_TWEAK", vb[3]);
  } else if (cmp0048 != cmPolicies::OLD) {
    // Set project VERSION variables to empty
    std::vector<std::string> vv;
    vv.emplace_back("PROJECT_VERSION");
    vv.emplace_back("PROJECT_VERSION_MAJOR");
    vv.emplace_back("PROJECT_VERSION_MINOR");
    vv.emplace_back("PROJECT_VERSION_PATCH");
    vv.emplace_back("PROJECT_VERSION_TWEAK");
    vv.push_back(projectName + "_VERSION");
    vv.push_back(projectName + "_VERSION_MAJOR");
    vv.push_back(projectName + "_VERSION_MINOR");
    vv.push_back(projectName + "_VERSION_PATCH");
    vv.push_back(projectName + "_VERSION_TWEAK");
    if (this->Makefile->IsRootMakefile()) {
      vv.emplace_back("CMAKE_PROJECT_VERSION");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MAJOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MINOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_PATCH");
      vv.emplace_back("CMAKE_PROJECT_VERSION_TWEAK");
    }
    std::string vw;
    for (std::string const& i : vv) {
      const char* v = this->Makefile->GetDefinition(i);
      if (v && *v) {
        if (cmp0048 == cmPolicies::WARN) {
          if (!injectedProjectCommand) {
            vw += "\n  ";
            vw += i;
          }
        } else {
          this->Makefile->AddDefinition(i, "");
        }
      }
    }
    if (!vw.empty()) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0048)
        << "\nThe following variable(s) would be set to empty:" << vw;
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    }
  }

  this->Makefile->AddDefinition("PROJECT_DESCRIPTION", description.c_str());
  this->Makefile->AddDefinition(projectName + "_DESCRIPTION",
                                description.c_str());
  TopLevelCMakeVarCondSet("CMAKE_PROJECT_DESCRIPTION", description.c_str());

  this->Makefile->AddDefinition("PROJECT_HOMEPAGE_URL", homepage.c_str());
  this->Makefile->AddDefinition(projectName + "_HOMEPAGE_URL",
                                homepage.c_str());
  TopLevelCMakeVarCondSet("CMAKE_PROJECT_HOMEPAGE_URL", homepage.c_str());

  if (languages.empty()) {
    // if no language is specified do c and c++
    languages.emplace_back("C");
    languages.emplace_back("CXX");
  }
  this->Makefile->EnableLanguage(languages, false);
  std::string extraInclude = "CMAKE_PROJECT_" + projectName + "_INCLUDE";
  const char* include = this->Makefile->GetDefinition(extraInclude);
  if (include) {
    bool readit = this->Makefile->ReadDependentFile(include);
    if (!readit && !cmSystemTools::GetFatalErrorOccured()) {
      std::string m = "could not find file:\n"
                      "  ";
      m += include;
      this->SetError(m);
      return false;
    }
  }
  return true;
}